

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::deinit(TessellationShaderTCTEDataPassThrough *this)

{
  TessellationShaderUtils *this_00;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference run;
  __normal_iterator<glcts::TessellationShaderTCTEDataPassThrough::_run_*,_std::vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>_>
  local_28;
  __normal_iterator<glcts::TessellationShaderTCTEDataPassThrough::_run_*,_std::vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>_>
  local_20;
  iterator it;
  Functions *gl;
  TessellationShaderTCTEDataPassThrough *this_local;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    it._M_current = (_run *)CONCAT44(extraout_var,iVar2);
    (*(code *)it._M_current[0x14].result_tc_position_data.
              super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
              super__Vector_impl_data._M_start)
              ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (*(code *)it._M_current[6].result_tc_position_data.
              super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
              super__Vector_impl_data._M_start)(0x8c89);
    (*(code *)((it._M_current)->result_tc_position_data).
              super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
              super__Vector_impl_data._M_finish)(0x8c8e,0);
    (*(code *)((it._M_current)->result_tc_position_data).
              super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(0x8c8e,0);
    (**(code **)&it._M_current[1].tes_id)(0);
    if (this->m_bo_id != 0) {
      (*(code *)it._M_current[5].result_tc_value1_data.
                super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                super__Vector_impl_data._M_start)(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (*(code *)it._M_current[5].result_te_pointSize_data.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage)(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    local_20._M_current =
         (_run *)std::
                 vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
                 ::begin(&this->m_runs);
    while( true ) {
      local_28._M_current =
           (_run *)std::
                   vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
                   ::end(&this->m_runs);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      run = __gnu_cxx::
            __normal_iterator<glcts::TessellationShaderTCTEDataPassThrough::_run_*,_std::vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>_>
            ::operator*(&local_20);
      deinitTestRun(this,run);
      __gnu_cxx::
      __normal_iterator<glcts::TessellationShaderTCTEDataPassThrough::_run_*,_std::vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>_>
      ::operator++(&local_20);
    }
    std::
    vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
    ::clear(&this->m_runs);
    if (this->m_utils_ptr != (TessellationShaderUtils *)0x0) {
      this_00 = this->m_utils_ptr;
      if (this_00 != (TessellationShaderUtils *)0x0) {
        TessellationShaderUtils::~TessellationShaderUtils(this_00);
        operator_delete(this_00,0x20);
      }
      this->m_utils_ptr = (TessellationShaderUtils *)0x0;
    }
  }
  return;
}

Assistant:

void TessellationShaderTCTEDataPassThrough::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Revert GL_PATCH_VERTICES_EXT value to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Revert TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release all objects we might've created */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	for (_runs::iterator it = m_runs.begin(); it != m_runs.end(); ++it)
	{
		deinitTestRun(*it);
	}
	m_runs.clear();

	/* Release Utils instance */
	if (m_utils_ptr != DE_NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = DE_NULL;
	}
}